

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::IsGB(MI<136UL,_GF2::MOGrevlex<136UL>_> *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *pMVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  bool bVar9;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  MP<136UL,_GF2::MOGrevlex<136UL>_> local_50;
  
  local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node._M_size = 0;
  bVar8 = (this->
          super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
          ).
          super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this;
  p_Var4 = (_List_node_base *)&local_50;
  local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_50;
  if (!bVar8) {
    p_Var7 = (_List_node_base *)this;
    do {
      uVar6 = 0;
      do {
        if (((ulong)(&p_Var7->_M_prev[1]._M_next[1]._M_next)[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0
           ) {
          pMVar3 = MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                             (&local_50,uVar6,
                              (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var7->_M_prev + 1));
          Reduce(this,pMVar3);
          p_Var4 = local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
                   super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl.
                   _M_node.super__List_node_base._M_next;
          if (local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              _M_size != 0) goto joined_r0x00127fd2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x88);
      for (p_Var4 = p_Var7->_M_prev;
          bVar9 = p_Var4 != (this->
                            super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                            ).
                            super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next, bVar9;
          p_Var4 = p_Var4->_M_prev) {
        p_Var1 = p_Var7->_M_prev[1]._M_next;
        p_Var2 = p_Var4->_M_prev[1]._M_next;
        if (((ulong)p_Var1[1]._M_next & (ulong)p_Var2[1]._M_next) == 0) {
          uVar6 = 0;
          do {
            uVar5 = uVar6;
            if (uVar5 == 2) break;
            uVar6 = uVar5 + 1;
          } while (((ulong)(&p_Var1[1]._M_prev)[uVar5] & (ulong)(&p_Var2[1]._M_prev)[uVar5]) == 0);
          if (uVar5 < 2) goto LAB_00127f69;
        }
        else {
LAB_00127f69:
          pMVar3 = MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                             (&local_50,(MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var7->_M_prev + 1),
                              (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var4->_M_prev + 1));
          Reduce(this,pMVar3);
          if (local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              _M_size != 0) goto LAB_00127fad;
        }
      }
      Env::Trace("IsGB: %zu polys");
LAB_00127fad:
      p_Var4 = local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (bVar9) break;
      p_Var7 = p_Var7->_M_prev;
      bVar8 = p_Var7 == (this->
                        super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                        ).
                        super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
    } while (!bVar8);
  }
joined_r0x00127fd2:
  while (p_Var4 != (_List_node_base *)&local_50) {
    p_Var7 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var4->_M_next)->
             super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var4,0x28);
    p_Var4 = p_Var7;
  }
  return bVar8;
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}